

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O2

pair<ctemplate::small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>::iterator,_bool>
* __thiscall
ctemplate::
small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
::insert(pair<ctemplate::small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>::iterator,_bool>
         *__return_storage_ptr__,
        small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
        *this,value_type *x)

{
  anon_union_160_3_1f8f2db0_for_small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>_6
  *this_00;
  char *pcVar1;
  unsigned_long *puVar2;
  size_t *psVar3;
  int iVar4;
  unsigned_long uVar5;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  long lVar9;
  char *pcVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>,_bool>
  pVar11;
  
  iVar4 = this->size_;
  lVar7 = (long)iVar4;
  this_00 = &this->field_2;
  if (lVar7 < 0) {
LAB_0012cdeb:
    pVar11 = std::
             _Rb_tree<unsigned_long,std::pair<unsigned_long_const,ctemplate::TemplateString>,std::_Select1st<std::pair<unsigned_long_const,ctemplate::TemplateString>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>
             ::_M_insert_unique<std::pair<unsigned_long_const,ctemplate::TemplateString>const&>
                       ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,ctemplate::TemplateString>,std::_Select1st<std::pair<unsigned_long_const,ctemplate::TemplateString>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>
                         *)&this_00->dummy_,x);
    bVar8 = pVar11.second;
    (__return_storage_ptr__->first).array_iter_ =
         (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)0x0;
    (__return_storage_ptr__->first).hash_iter_._M_node = pVar11.first._M_node._M_node;
  }
  else {
    lVar9 = lVar7 + 1;
    pcVar10 = this[-1].field_2.array_[3].space_ + 8;
    do {
      lVar9 = lVar9 + -1;
      if (lVar9 == 0) {
        if (iVar4 == 4) {
          ConvertToRealMap(this);
          goto LAB_0012cdeb;
        }
        lVar7 = lVar7 * 0x28;
        *(TemplateId *)((long)&this->field_2 + lVar7 + 0x20) = (x->second).id_;
        uVar5 = x->first;
        pcVar10 = (x->second).ptr_;
        sVar6 = *(size_t *)&(x->second).is_immutable_;
        psVar3 = (size_t *)((long)&this->field_2 + lVar7 + 0x10);
        *psVar3 = (x->second).length_;
        psVar3[1] = sVar6;
        *(unsigned_long *)((long)this_00 + lVar7) = uVar5;
        ((unsigned_long *)((long)this_00 + lVar7))[1] = (unsigned_long)pcVar10;
        this->size_ = iVar4 + 1;
        (__return_storage_ptr__->first).array_iter_ =
             (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
             ((long)this_00 + lVar7);
        (__return_storage_ptr__->first).hash_iter_._M_node = (_Base_ptr)0x0;
        bVar8 = true;
        goto LAB_0012ce33;
      }
      pcVar1 = pcVar10 + 0x28;
      puVar2 = (unsigned_long *)(pcVar10 + 0x28);
      pcVar10 = pcVar1;
    } while (*puVar2 != x->first);
    (__return_storage_ptr__->first).array_iter_ =
         (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)pcVar1;
    (__return_storage_ptr__->first).hash_iter_._M_node = (_Base_ptr)0x0;
    bVar8 = false;
  }
LAB_0012ce33:
  __return_storage_ptr__->second = bVar8;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(const value_type& x) {
    key_equal compare;

    if (size_ >= 0) {
      for (int i = 0; i < size_; i++) {
        if (compare(array_[i]->first, x.first)) {
          return std::make_pair(iterator(array_ + i), false);
        }
      }
      if (size_ == kArraySize) {
        ConvertToRealMap();  // Invalidates all iterators!
        std::pair<typename NormalMap::iterator, bool> ret = map_->insert(x);
        return std::make_pair(iterator(ret.first), ret.second);
      } else {
        array_[size_].Init(x);
        return std::make_pair(iterator(array_ + size_++), true);
      }
    } else {
      std::pair<typename NormalMap::iterator, bool> ret = map_->insert(x);
      return std::make_pair(iterator(ret.first), ret.second);
    }
  }